

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllipsoidRecord2.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::EllipsoidRecord2::EllipsoidRecord2(EllipsoidRecord2 *this)

{
  EllipsoidRecord1::EllipsoidRecord1(&this->super_EllipsoidRecord1);
  (this->super_EllipsoidRecord1).super_EnvironmentRecord.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EllipsoidRecord2_00222200;
  Vector::Vector(&this->m_DDT);
  Vector::Vector(&this->m_Velocity);
  Vector::Vector(&this->m_AngularVelocity);
  this->m_ui32Padding = 0;
  (this->super_EllipsoidRecord1).super_EnvironmentRecord.m_ui32EnvRecTyp = 0x10000000;
  (this->super_EllipsoidRecord1).super_EnvironmentRecord.m_ui16Length = 0x2c0;
  return;
}

Assistant:

EllipsoidRecord2::EllipsoidRecord2() :
    m_ui32Padding( 0 )
{
    m_ui32EnvRecTyp = EllipsoidRecord2Type;
    m_ui16Length = ( ELIPSOID_RECORD_2_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}